

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  ushort uVar7;
  int iVar8;
  ImU32 IVar9;
  uint uVar10;
  GetterXsYs<unsigned_short> *pGVar11;
  TransformerLogLog *pTVar12;
  ImPlotPlot *pIVar13;
  GetterXsYRef<unsigned_short> *pGVar14;
  ImDrawVert *pIVar15;
  ImDrawIdx *pIVar16;
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  ImDrawIdx IVar19;
  long lVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  
  pIVar17 = GImPlot;
  pGVar11 = this->Getter1;
  pTVar12 = this->Transformer;
  iVar8 = pGVar11->Count;
  lVar20 = (long)(((pGVar11->Offset + prim) % iVar8 + iVar8) % iVar8) * (long)pGVar11->Stride;
  uVar7 = *(ushort *)((long)pGVar11->Ys + lVar20);
  dVar25 = log10((double)*(ushort *)((long)pGVar11->Xs + lVar20) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar17->LogDenX;
  pIVar13 = pIVar17->CurrentPlot;
  dVar3 = (pIVar13->XAxis).Range.Min;
  dVar4 = (pIVar13->XAxis).Range.Max;
  dVar26 = log10((double)uVar7 / pIVar13->YAxis[pTVar12->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar8 = pTVar12->YAxis;
  pIVar13 = pIVar17->CurrentPlot;
  dVar5 = pIVar13->YAxis[iVar8].Range.Min;
  fVar27 = (float)((((double)(float)(dVar25 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar13->XAxis).Range.Min) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar8].Min.x);
  fVar22 = (float)((((double)(float)(dVar26 / pIVar17->LogDenY[iVar8]) *
                     (pIVar13->YAxis[iVar8].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar17->My[iVar8] + (double)pIVar17->PixelRange[iVar8].Min.y);
  pGVar14 = this->Getter2;
  pTVar12 = this->Transformer;
  iVar8 = pGVar14->Count;
  dVar2 = pGVar14->YRef;
  dVar25 = log10((double)*(ushort *)
                          ((long)pGVar14->Xs +
                          (long)(((prim + pGVar14->Offset) % iVar8 + iVar8) % iVar8) *
                          (long)pGVar14->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar18->LogDenX;
  pIVar13 = pIVar18->CurrentPlot;
  dVar4 = (pIVar13->XAxis).Range.Min;
  dVar5 = (pIVar13->XAxis).Range.Max;
  dVar26 = log10(dVar2 / pIVar13->YAxis[pTVar12->YAxis].Range.Min);
  iVar8 = pTVar12->YAxis;
  pIVar13 = pIVar18->CurrentPlot;
  dVar2 = pIVar13->YAxis[iVar8].Range.Min;
  fVar28 = (float)((((double)(float)(dVar25 / dVar3) * (dVar5 - dVar4) + dVar4) -
                   (pIVar13->XAxis).Range.Min) * pIVar18->Mx +
                  (double)pIVar18->PixelRange[iVar8].Min.x);
  fVar29 = (float)((((double)(float)(dVar26 / pIVar18->LogDenY[iVar8]) *
                     (pIVar13->YAxis[iVar8].Range.Max - dVar2) + dVar2) - dVar2) *
                   pIVar18->My[iVar8] + (double)pIVar18->PixelRange[iVar8].Min.y);
  fVar23 = fVar22;
  if (fVar29 <= fVar22) {
    fVar23 = fVar29;
  }
  bVar21 = false;
  if ((fVar23 < (cull_rect->Max).y) &&
     (fVar23 = (float)(~-(uint)(fVar29 <= fVar22) & (uint)fVar29 |
                      -(uint)(fVar29 <= fVar22) & (uint)fVar22), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar23 && fVar23 != *pfVar1)) {
    fVar23 = fVar27;
    if (fVar28 <= fVar27) {
      fVar23 = fVar28;
    }
    bVar21 = false;
    if (fVar23 < (cull_rect->Max).x) {
      fVar23 = (float)(~-(uint)(fVar28 <= fVar27) & (uint)fVar28 |
                      -(uint)(fVar28 <= fVar27) & (uint)fVar27);
      bVar21 = (cull_rect->Min).x <= fVar23 && fVar23 != (cull_rect->Min).x;
    }
  }
  if (bVar21 != false) {
    fVar23 = this->Weight;
    IVar9 = this->Col;
    IVar6 = *uv;
    fVar30 = fVar28 - fVar27;
    fVar31 = fVar29 - fVar22;
    fVar24 = fVar30 * fVar30 + fVar31 * fVar31;
    if (0.0 < fVar24) {
      if (fVar24 < 0.0) {
        fVar24 = sqrtf(fVar24);
      }
      else {
        fVar24 = SQRT(fVar24);
      }
      fVar30 = fVar30 * (1.0 / fVar24);
      fVar31 = fVar31 * (1.0 / fVar24);
    }
    fVar23 = fVar23 * 0.5;
    fVar30 = fVar30 * fVar23;
    fVar23 = fVar23 * fVar31;
    pIVar15 = DrawList->_VtxWritePtr;
    (pIVar15->pos).x = fVar23 + fVar27;
    (pIVar15->pos).y = fVar22 - fVar30;
    pIVar15->uv = IVar6;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15->col = IVar9;
    pIVar15[1].pos.x = fVar23 + fVar28;
    pIVar15[1].pos.y = fVar29 - fVar30;
    pIVar15[1].uv = IVar6;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[1].col = IVar9;
    pIVar15[2].pos.x = fVar28 - fVar23;
    pIVar15[2].pos.y = fVar30 + fVar29;
    pIVar15[2].uv = IVar6;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[2].col = IVar9;
    pIVar15[3].pos.x = fVar27 - fVar23;
    pIVar15[3].pos.y = fVar30 + fVar22;
    pIVar15[3].uv = IVar6;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar15 + 4;
    uVar10 = DrawList->_VtxCurrentIdx;
    pIVar16 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar10;
    *pIVar16 = IVar19;
    pIVar16[1] = IVar19 + 1;
    pIVar16[2] = IVar19 + 2;
    pIVar16[3] = IVar19;
    pIVar16[4] = IVar19 + 2;
    pIVar16[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar16 + 6;
    DrawList->_VtxCurrentIdx = uVar10 + 4;
  }
  return bVar21;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }